

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_add_item_to_object_should_not_use_after_free_when_string_is_aliased(void)

{
  cJSON *object;
  cJSON *item;
  uchar *string;
  internal_hooks *in_RSI;
  
  object = cJSON_CreateObject();
  item = cJSON_CreateNumber(42.0);
  string = cJSON_strdup("number",in_RSI);
  if (object == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x23b);
  }
  if (item == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x23c);
  }
  if (string == (uchar *)0x0) {
    UnityFail(" Expected Non-NULL",0x23d);
  }
  item->string = (char *)string;
  cJSON_AddItemToObject(object,(char *)string,item);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_item_to_object_should_not_use_after_free_when_string_is_aliased(void)
{
    cJSON *object = cJSON_CreateObject();
    cJSON *number = cJSON_CreateNumber(42);
    char *name = (char*)cJSON_strdup((const unsigned char*)"number", &global_hooks);

    TEST_ASSERT_NOT_NULL(object);
    TEST_ASSERT_NOT_NULL(number);
    TEST_ASSERT_NOT_NULL(name);

    number->string = name;

    /* The following should not have a use after free
     * that would show up in valgrind or with AddressSanitizer */
    cJSON_AddItemToObject(object, number->string, number);

    cJSON_Delete(object);
}